

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gz_creation.c
# Opt level: O1

int main(int argc,char **argv)

{
  test_gz_creation();
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {

	int ret = 0;
#if defined(NHR_GZIP)
	ret += test_gz_creation();
	assert(ret == 0);
#endif

	return ret;
}